

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O2

void Abc_SclComputeLoad(SC_Man *p)

{
  uint uVar1;
  SC_Pair *pSVar2;
  SC_WireLoad *pWL;
  Abc_Obj_t *pAVar3;
  SC_Cell *pSVar4;
  void *pvVar5;
  long *plVar6;
  Vec_Flt_t *pVVar7;
  int iVar8;
  uint uVar9;
  Abc_Ntk_t *pNtk;
  long lVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  SC_Pair SVar14;
  SC_Pair SVar15;
  
  iVar8 = 0;
  while( true ) {
    pNtk = p->pNtk;
    iVar11 = pNtk->vObjs->nSize;
    if (iVar11 <= iVar8) break;
    pAVar3 = Abc_NtkObj(pNtk,iVar8);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) != 3)) {
      pSVar2 = p->pLoads;
      uVar9 = pAVar3->Id;
      pSVar2[uVar9].rise = 0.0;
      pSVar2[uVar9].fall = 0.0;
    }
    iVar8 = iVar8 + 1;
  }
  for (iVar8 = 0; iVar8 < iVar11; iVar8 = iVar8 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar8);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       ((pAVar3->vFanins).nSize != 0)) {
      pSVar4 = Abc_SclObjCell(pAVar3);
      for (lVar10 = 0; lVar10 < (pAVar3->vFanins).nSize; lVar10 = lVar10 + 1) {
        pSVar2 = p->pLoads;
        uVar9 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar10]] + 0x10
                         );
        pvVar5 = Vec_PtrEntry(&pSVar4->vPins,(int)lVar10);
        SVar15 = pSVar2[uVar9];
        SVar14.rise = SVar15.rise + (float)*(undefined8 *)((long)pvVar5 + 0x10);
        SVar14.fall = SVar15.fall + (float)((ulong)*(undefined8 *)((long)pvVar5 + 0x10) >> 0x20);
        pSVar2[uVar9] = SVar14;
      }
    }
    pNtk = p->pNtk;
    iVar11 = pNtk->vObjs->nSize;
  }
  for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
    plVar6 = (long *)Vec_PtrEntry(pNtk->vCos,iVar8);
    pSVar2 = p->pLoads;
    uVar9 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                               (long)*(int *)plVar6[4] * 8) + 0x10);
    SVar15.rise = pSVar2[uVar9].rise + pSVar2[*(uint *)(plVar6 + 2)].rise;
    SVar15.fall = pSVar2[uVar9].fall + pSVar2[*(uint *)(plVar6 + 2)].fall;
    pSVar2[uVar9] = SVar15;
    pNtk = p->pNtk;
  }
  pWL = p->pWLoadUsed;
  if (pWL != (SC_WireLoad *)0x0) {
    if (p->vWireCaps == (Vec_Flt_t *)0x0) {
      iVar8 = Abc_NtkGetFanoutMax(pNtk);
      pVVar7 = Abc_SclFindWireCaps(pWL,iVar8);
      p->vWireCaps = pVVar7;
    }
    for (iVar8 = 0; pNtk = p->pNtk, iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar8);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         ((pAVar3->vFanins).nSize != 0)) {
        Abc_SclAddWireLoad(p,pAVar3,0);
      }
    }
    for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar8);
      Abc_SclAddWireLoad(p,pAVar3,0);
      pNtk = p->pNtk;
    }
  }
  if (p->vInDrive != (Vec_Flt_t *)0x0) {
    for (uVar9 = 0; (int)uVar9 < pNtk->vPis->nSize; uVar9 = uVar9 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,uVar9);
      pSVar2 = p->pLoads;
      uVar1 = pAVar3->Id;
      fVar12 = Abc_SclObjInDrive(p,pAVar3);
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar12 = pSVar2[uVar1].rise;
        fVar13 = Abc_SclObjInDrive(p,pAVar3);
        if (fVar12 <= fVar13) {
          fVar12 = pSVar2[uVar1].fall;
          fVar13 = Abc_SclObjInDrive(p,pAVar3);
          if (fVar12 <= fVar13) goto LAB_003bf9ea;
        }
        printf("Maximum input drive strength is exceeded at primary input %d.\n",(ulong)uVar9);
      }
LAB_003bf9ea:
      pNtk = p->pNtk;
    }
  }
  iVar11 = 0;
  fVar12 = 0.0;
  for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar8);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       ((pAVar3->vFanins).nSize != 0)) {
      fVar12 = fVar12 + p->pLoads[(uint)pAVar3->Id].fall * 0.5 +
                        p->pLoads[(uint)pAVar3->Id].rise * 0.5;
      iVar11 = iVar11 + 1;
    }
    pNtk = p->pNtk;
  }
  for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,iVar8);
    pNtk = p->pNtk;
    fVar12 = fVar12 + p->pLoads[(uint)pAVar3->Id].fall * 0.5 +
                      p->pLoads[(uint)pAVar3->Id].rise * 0.5;
  }
  p->EstLoadAve = fVar12 / (float)(iVar11 + iVar8);
  return;
}

Assistant:

void Abc_SclComputeLoad( SC_Man * p )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // clear load storage
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        if ( !Abc_ObjIsPo(pObj) )
            pLoad->rise = pLoad->fall = 0.0;
    }
    // add cell load
    Abc_NtkForEachNode1( p->pNtk, pObj, i )
    {
        SC_Cell * pCell = Abc_SclObjCell( pObj );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
            SC_Pin * pPin = SC_CellPin( pCell, k );
            pLoad->rise += pPin->rise_cap;
            pLoad->fall += pPin->fall_cap;
        }
    }
    // add PO load
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pLoadPo = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoad = Abc_SclObjLoad( p, Abc_ObjFanin0(pObj) );
        pLoad->rise += pLoadPo->rise;
        pLoad->fall += pLoadPo->fall;
    }
    // add wire load
    if ( p->pWLoadUsed != NULL )
    {
        if ( p->vWireCaps == NULL )
            p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(p->pNtk) );
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
        Abc_NtkForEachPi( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
    }
    // check input loads
    if ( p->vInDrive != NULL )
    {
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            if ( Abc_SclObjInDrive(p, pObj) != 0 && (pLoad->rise > Abc_SclObjInDrive(p, pObj) || pLoad->fall > Abc_SclObjInDrive(p, pObj)) )
                printf( "Maximum input drive strength is exceeded at primary input %d.\n", i );
        }
    }
/*
    // transfer load from barbufs
    Abc_NtkForEachBarBuf( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoadF = Abc_SclObjLoad( p, Abc_ObjFanin(pObj, 0) );
        SC_PairAdd( pLoadF, pLoad );
    }
*/
    // calculate average load
//    if ( p->EstLoadMax )
    {
        double TotalLoad = 0;
        int nObjs = 0;
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        p->EstLoadAve = (float)(TotalLoad / nObjs);
//        printf( "Average load = %.2f\n", p->EstLoadAve );
    }
}